

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::FileOptions::SerializeWithCachedSizes(FileOptions *this,CodedOutputStream *output)

{
  bool bVar1;
  int iVar2;
  FileOptions_OptimizeMode value;
  uint uVar3;
  char *pcVar4;
  string *psVar5;
  UninterpretedOption *value_00;
  UnknownFieldSet *unknown_fields;
  uint local_40;
  uint n;
  uint i;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  FileOptions *this_local;
  
  uVar3 = (this->_has_bits_).has_bits_[0];
  if ((uVar3 & 1) != 0) {
    java_package_abi_cxx11_(this);
    pcVar4 = (char *)std::__cxx11::string::data();
    java_package_abi_cxx11_(this);
    iVar2 = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar4,iVar2,SERIALIZE,"google.protobuf.FileOptions.java_package");
    psVar5 = java_package_abi_cxx11_(this);
    internal::WireFormatLite::WriteStringMaybeAliased(1,psVar5,output);
  }
  if ((uVar3 & 2) != 0) {
    java_outer_classname_abi_cxx11_(this);
    pcVar4 = (char *)std::__cxx11::string::data();
    java_outer_classname_abi_cxx11_(this);
    iVar2 = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar4,iVar2,SERIALIZE,"google.protobuf.FileOptions.java_outer_classname");
    psVar5 = java_outer_classname_abi_cxx11_(this);
    internal::WireFormatLite::WriteStringMaybeAliased(8,psVar5,output);
  }
  if ((uVar3 & 0x8000) != 0) {
    value = optimize_for(this);
    internal::WireFormatLite::WriteEnum(9,value,output);
  }
  if ((uVar3 & 0x80) != 0) {
    bVar1 = java_multiple_files(this);
    internal::WireFormatLite::WriteBool(10,bVar1,output);
  }
  if ((uVar3 & 4) != 0) {
    go_package_abi_cxx11_(this);
    pcVar4 = (char *)std::__cxx11::string::data();
    go_package_abi_cxx11_(this);
    iVar2 = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar4,iVar2,SERIALIZE,"google.protobuf.FileOptions.go_package");
    psVar5 = go_package_abi_cxx11_(this);
    internal::WireFormatLite::WriteStringMaybeAliased(0xb,psVar5,output);
  }
  if ((uVar3 & 0x400) != 0) {
    bVar1 = cc_generic_services(this);
    internal::WireFormatLite::WriteBool(0x10,bVar1,output);
  }
  if ((uVar3 & 0x800) != 0) {
    bVar1 = java_generic_services(this);
    internal::WireFormatLite::WriteBool(0x11,bVar1,output);
  }
  if ((uVar3 & 0x1000) != 0) {
    bVar1 = py_generic_services(this);
    internal::WireFormatLite::WriteBool(0x12,bVar1,output);
  }
  if ((uVar3 & 0x100) != 0) {
    bVar1 = java_generate_equals_and_hash(this);
    internal::WireFormatLite::WriteBool(0x14,bVar1,output);
  }
  if ((uVar3 & 0x2000) != 0) {
    bVar1 = deprecated(this);
    internal::WireFormatLite::WriteBool(0x17,bVar1,output);
  }
  if ((uVar3 & 0x200) != 0) {
    bVar1 = java_string_check_utf8(this);
    internal::WireFormatLite::WriteBool(0x1b,bVar1,output);
  }
  if ((uVar3 & 0x4000) != 0) {
    bVar1 = cc_enable_arenas(this);
    internal::WireFormatLite::WriteBool(0x1f,bVar1,output);
  }
  if ((uVar3 & 8) != 0) {
    objc_class_prefix_abi_cxx11_(this);
    pcVar4 = (char *)std::__cxx11::string::data();
    objc_class_prefix_abi_cxx11_(this);
    iVar2 = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar4,iVar2,SERIALIZE,"google.protobuf.FileOptions.objc_class_prefix");
    psVar5 = objc_class_prefix_abi_cxx11_(this);
    internal::WireFormatLite::WriteStringMaybeAliased(0x24,psVar5,output);
  }
  if ((uVar3 & 0x10) != 0) {
    csharp_namespace_abi_cxx11_(this);
    pcVar4 = (char *)std::__cxx11::string::data();
    csharp_namespace_abi_cxx11_(this);
    iVar2 = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar4,iVar2,SERIALIZE,"google.protobuf.FileOptions.csharp_namespace");
    psVar5 = csharp_namespace_abi_cxx11_(this);
    internal::WireFormatLite::WriteStringMaybeAliased(0x25,psVar5,output);
  }
  if ((uVar3 & 0x20) != 0) {
    swift_prefix_abi_cxx11_(this);
    pcVar4 = (char *)std::__cxx11::string::data();
    swift_prefix_abi_cxx11_(this);
    iVar2 = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar4,iVar2,SERIALIZE,"google.protobuf.FileOptions.swift_prefix");
    psVar5 = swift_prefix_abi_cxx11_(this);
    internal::WireFormatLite::WriteStringMaybeAliased(0x27,psVar5,output);
  }
  if ((uVar3 & 0x40) != 0) {
    php_class_prefix_abi_cxx11_(this);
    pcVar4 = (char *)std::__cxx11::string::data();
    php_class_prefix_abi_cxx11_(this);
    iVar2 = std::__cxx11::string::length();
    internal::WireFormat::VerifyUTF8StringNamedField
              (pcVar4,iVar2,SERIALIZE,"google.protobuf.FileOptions.php_class_prefix");
    psVar5 = php_class_prefix_abi_cxx11_(this);
    internal::WireFormatLite::WriteStringMaybeAliased(0x28,psVar5,output);
  }
  local_40 = 0;
  uVar3 = uninterpreted_option_size(this);
  for (; local_40 < uVar3; local_40 = local_40 + 1) {
    value_00 = uninterpreted_option(this,local_40);
    internal::WireFormatLite::WriteMessageMaybeToArray(999,(MessageLite *)value_00,output);
  }
  internal::ExtensionSet::SerializeWithCachedSizes(&this->_extensions_,1000,0x20000000,output);
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    unknown_fields = FileOptions::unknown_fields(this);
    internal::WireFormat::SerializeUnknownFields(unknown_fields,output);
  }
  return;
}

Assistant:

void FileOptions::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:google.protobuf.FileOptions)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional string java_package = 1;
  if (cached_has_bits & 0x00000001u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->java_package().data(), this->java_package().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.FileOptions.java_package");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      1, this->java_package(), output);
  }

  // optional string java_outer_classname = 8;
  if (cached_has_bits & 0x00000002u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->java_outer_classname().data(), this->java_outer_classname().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.FileOptions.java_outer_classname");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      8, this->java_outer_classname(), output);
  }

  // optional .google.protobuf.FileOptions.OptimizeMode optimize_for = 9 [default = SPEED];
  if (cached_has_bits & 0x00008000u) {
    ::google::protobuf::internal::WireFormatLite::WriteEnum(
      9, this->optimize_for(), output);
  }

  // optional bool java_multiple_files = 10 [default = false];
  if (cached_has_bits & 0x00000080u) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(10, this->java_multiple_files(), output);
  }

  // optional string go_package = 11;
  if (cached_has_bits & 0x00000004u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->go_package().data(), this->go_package().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.FileOptions.go_package");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      11, this->go_package(), output);
  }

  // optional bool cc_generic_services = 16 [default = false];
  if (cached_has_bits & 0x00000400u) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(16, this->cc_generic_services(), output);
  }

  // optional bool java_generic_services = 17 [default = false];
  if (cached_has_bits & 0x00000800u) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(17, this->java_generic_services(), output);
  }

  // optional bool py_generic_services = 18 [default = false];
  if (cached_has_bits & 0x00001000u) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(18, this->py_generic_services(), output);
  }

  // optional bool java_generate_equals_and_hash = 20 [deprecated = true];
  if (cached_has_bits & 0x00000100u) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(20, this->java_generate_equals_and_hash(), output);
  }

  // optional bool deprecated = 23 [default = false];
  if (cached_has_bits & 0x00002000u) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(23, this->deprecated(), output);
  }

  // optional bool java_string_check_utf8 = 27 [default = false];
  if (cached_has_bits & 0x00000200u) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(27, this->java_string_check_utf8(), output);
  }

  // optional bool cc_enable_arenas = 31 [default = false];
  if (cached_has_bits & 0x00004000u) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(31, this->cc_enable_arenas(), output);
  }

  // optional string objc_class_prefix = 36;
  if (cached_has_bits & 0x00000008u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->objc_class_prefix().data(), this->objc_class_prefix().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.FileOptions.objc_class_prefix");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      36, this->objc_class_prefix(), output);
  }

  // optional string csharp_namespace = 37;
  if (cached_has_bits & 0x00000010u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->csharp_namespace().data(), this->csharp_namespace().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.FileOptions.csharp_namespace");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      37, this->csharp_namespace(), output);
  }

  // optional string swift_prefix = 39;
  if (cached_has_bits & 0x00000020u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->swift_prefix().data(), this->swift_prefix().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.FileOptions.swift_prefix");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      39, this->swift_prefix(), output);
  }

  // optional string php_class_prefix = 40;
  if (cached_has_bits & 0x00000040u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->php_class_prefix().data(), this->php_class_prefix().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.FileOptions.php_class_prefix");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      40, this->php_class_prefix(), output);
  }

  // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
  for (unsigned int i = 0, n = this->uninterpreted_option_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      999, this->uninterpreted_option(i), output);
  }

  // Extension range [1000, 536870912)
  _extensions_.SerializeWithCachedSizes(
      1000, 536870912, output);

  if (_internal_metadata_.have_unknown_fields()) {
    ::google::protobuf::internal::WireFormat::SerializeUnknownFields(
        unknown_fields(), output);
  }
  // @@protoc_insertion_point(serialize_end:google.protobuf.FileOptions)
}